

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Prog * re2::Compiler::Compile(Regexp *re,bool reversed,int64_t max_mem)

{
  Regexp *this;
  bool bVar1;
  bool bVar2;
  Frag FVar3;
  Frag FVar4;
  Prog *pPVar5;
  bool bVar6;
  Regexp *sre;
  Compiler c;
  Regexp *local_c8;
  Compiler local_c0;
  
  Compiler(&local_c0);
  Setup(&local_c0,(uint)re->parse_flags_,max_mem,UNANCHORED);
  local_c0.reversed_ = reversed;
  local_c8 = Regexp::Simplify(re);
  if (local_c8 != (Regexp *)0x0) {
    bVar1 = IsAnchorStart(&local_c8,0);
    bVar2 = IsAnchorEnd(&local_c8,0);
    this = local_c8;
    FVar3 = Regexp::Walker<re2::Frag>::WalkExponential
                      (&local_c0.super_Walker<re2::Frag>,local_c8,(Frag)0x0,local_c0.max_ninst_ * 2)
    ;
    Regexp::Decref(this);
    if (local_c0.failed_ == false) {
      local_c0.reversed_ = false;
      FVar4 = Match(&local_c0,0);
      FVar3 = Cat(&local_c0,FVar3,FVar4);
      (local_c0.prog_)->reversed_ = reversed;
      bVar6 = bVar2;
      if (reversed) {
        bVar6 = bVar1;
        bVar1 = bVar2;
      }
      (local_c0.prog_)->anchor_start_ = bVar1;
      (local_c0.prog_)->anchor_end_ = bVar6;
      (local_c0.prog_)->start_ = FVar3.begin;
      if (bVar1 == false) {
        FVar4 = DotStar(&local_c0);
        FVar3 = Cat(&local_c0,FVar4,FVar3);
      }
      (local_c0.prog_)->start_unanchored_ = FVar3.begin;
      pPVar5 = Finish(&local_c0);
      goto LAB_001adf5a;
    }
  }
  pPVar5 = (Prog *)0x0;
LAB_001adf5a:
  ~Compiler(&local_c0);
  return pPVar5;
}

Assistant:

Prog* Compiler::Compile(Regexp* re, bool reversed, int64_t max_mem) {
  Compiler c;
  c.Setup(re->parse_flags(), max_mem, RE2::UNANCHORED /* unused */);
  c.reversed_ = reversed;

  // Simplify to remove things like counted repetitions
  // and character classes like \d.
  Regexp* sre = re->Simplify();
  if (sre == NULL)
    return NULL;

  // Record whether prog is anchored, removing the anchors.
  // (They get in the way of other optimizations.)
  bool is_anchor_start = IsAnchorStart(&sre, 0);
  bool is_anchor_end = IsAnchorEnd(&sre, 0);

  // Generate fragment for entire regexp.
  Frag all = c.WalkExponential(sre, Frag(), 2*c.max_ninst_);
  sre->Decref();
  if (c.failed_)
    return NULL;

  // Success!  Finish by putting Match node at end, and record start.
  // Turn off c.reversed_ (if it is set) to force the remaining concatenations
  // to behave normally.
  c.reversed_ = false;
  all = c.Cat(all, c.Match(0));

  c.prog_->set_reversed(reversed);
  if (c.prog_->reversed()) {
    c.prog_->set_anchor_start(is_anchor_end);
    c.prog_->set_anchor_end(is_anchor_start);
  } else {
    c.prog_->set_anchor_start(is_anchor_start);
    c.prog_->set_anchor_end(is_anchor_end);
  }

  c.prog_->set_start(all.begin);
  if (!c.prog_->anchor_start()) {
    // Also create unanchored version, which starts with a .*? loop.
    all = c.Cat(c.DotStar(), all);
  }
  c.prog_->set_start_unanchored(all.begin);

  // Hand ownership of prog_ to caller.
  return c.Finish();
}